

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManPrintCone2(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vNodes_00;
  bool bVar3;
  int local_24;
  int i;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  vNodes_00 = Vec_IntAlloc(100);
  Gia_ManPrintCollect2_rec(p,pObj,vNodes_00);
  uVar1 = Gia_ObjId(p,pObj);
  printf("GIA logic cone for node %d:\n",(ulong)uVar1);
  local_24 = 0;
  vNodes = (Vec_Int_t *)pObj;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes_00);
    bVar3 = false;
    if (local_24 < iVar2) {
      iVar2 = Vec_IntEntry(vNodes_00,local_24);
      vNodes = (Vec_Int_t *)Gia_ManObj(p,iVar2);
      bVar3 = vNodes != (Vec_Int_t *)0x0;
    }
    if (!bVar3) break;
    Gia_ObjPrint(p,(Gia_Obj_t *)vNodes);
    local_24 = local_24 + 1;
  }
  Vec_IntFree(vNodes_00);
  return;
}

Assistant:

void Gia_ManPrintCone2( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vNodes;
    int i;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManPrintCollect2_rec( p, pObj, vNodes );
    printf( "GIA logic cone for node %d:\n", Gia_ObjId(p, pObj) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Gia_ObjPrint( p, pObj );
    Vec_IntFree( vNodes );
}